

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

ACCEPTED_HANDLE accepted_clone(ACCEPTED_HANDLE value)

{
  ACCEPTED_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (ACCEPTED_HANDLE)malloc(8);
  if (__ptr != (ACCEPTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (ACCEPTED_HANDLE)0x0;
}

Assistant:

ACCEPTED_HANDLE accepted_clone(ACCEPTED_HANDLE value)
{
    ACCEPTED_INSTANCE* accepted_instance = (ACCEPTED_INSTANCE*)malloc(sizeof(ACCEPTED_INSTANCE));
    if (accepted_instance != NULL)
    {
        accepted_instance->composite_value = amqpvalue_clone(((ACCEPTED_INSTANCE*)value)->composite_value);
        if (accepted_instance->composite_value == NULL)
        {
            free(accepted_instance);
            accepted_instance = NULL;
        }
    }

    return accepted_instance;
}